

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O1

int http_parse(HTTP_INFO *hi)

{
  long *plVar1;
  char *pcVar2;
  BOOL BVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  size_t sVar9;
  long *plVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char t1 [256];
  char local_238 [256];
  char local_138 [264];
  
  if (hi->r_len < 1) {
    return -1;
  }
  pcVar2 = hi->r_buf;
  plVar1 = &hi->body_len;
  pcVar13 = (hi->response).location;
  pcVar11 = pcVar2;
LAB_001111c0:
  do {
    while (hi->header_end != '\0') {
      BVar3 = (hi->response).chunked;
      if ((BVar3 == '\x01') && (hi->length == -1)) {
        pcVar12 = pcVar2 + (hi->r_len - (long)pcVar11);
        if ((long)pcVar12 < 1) goto LAB_001116ed;
        pcVar7 = strstr(pcVar11,"\r\n");
        if (pcVar7 == (char *)0x0) goto LAB_00111719;
        *pcVar7 = '\0';
        lVar8 = strtol(pcVar11,(char **)0x0,0x10);
        hi->length = lVar8;
        if (lVar8 == 0) {
          (hi->response).chunked = '\0';
        }
        else {
          plVar10 = &(hi->response).content_length;
          *plVar10 = *plVar10 + lVar8;
        }
        goto LAB_00111533;
      }
      sVar9 = hi->length;
      if (0 < (long)sVar9) {
        pcVar12 = pcVar2 + (hi->r_len - (long)pcVar11);
        if ((long)pcVar12 <= (long)sVar9) {
          lVar8 = hi->body_size;
          uVar4 = hi->body_len;
          if ((long)uVar4 < lVar8 + -1) {
            pcVar2 = pcVar12 + uVar4;
            pcVar13 = (char *)(~uVar4 + lVar8);
            if ((long)pcVar2 < lVar8) {
              pcVar13 = pcVar12;
            }
            pcVar7 = (char *)0xffffffffffffffff;
            if ((long)pcVar2 < lVar8) {
              pcVar7 = pcVar12;
            }
            strncpy(hi->body + uVar4,pcVar11,(size_t)pcVar13);
            lVar8 = (&hi->body_size)[(long)pcVar2 < lVar8];
            hi->body_len = (long)(pcVar7 + lVar8);
            hi->body[(long)(pcVar7 + lVar8)] = '\0';
          }
          lVar8 = hi->length - (long)pcVar12;
          hi->length = lVar8;
          hi->r_len = 0;
          if ((hi->response).chunked != '\0') {
            return 0;
          }
          if (0 < lVar8) {
            return 0;
          }
          return 1;
        }
        uVar4 = *plVar1;
        lVar8 = hi->body_size;
        if ((long)uVar4 < lVar8 + -1) {
          if ((long)(uVar4 + sVar9) < lVar8) {
            strncpy(hi->body + uVar4,pcVar11,sVar9);
            lVar8 = hi->length;
            plVar10 = plVar1;
          }
          else {
            strncpy(hi->body + uVar4,pcVar11,lVar8 + ~uVar4);
            lVar8 = -1;
            plVar10 = &hi->body_size;
          }
          lVar5 = *plVar10;
          *plVar1 = lVar8 + lVar5;
          hi->body[lVar8 + lVar5] = '\0';
        }
        if (((hi->response).chunked != '\x01') || ((long)pcVar12 - hi->length < 2)) {
          return -1;
        }
        pcVar11 = pcVar11 + hi->length + 2;
        hi->length = -1;
        goto LAB_001111c0;
      }
      if (BVar3 == '\0') {
        return 1;
      }
      if ((2 < hi->r_len) && (*(short *)pcVar11 == 0xa0d)) {
        pcVar11 = pcVar11 + 2;
        hi->length = -1;
        goto LAB_001111c0;
      }
      hi->length = -1;
      hi->r_len = 0;
    }
    pcVar7 = strstr(pcVar11,"\r\n");
    if (pcVar7 == (char *)0x0) {
      pcVar13 = pcVar2 + (hi->r_len - (long)pcVar11);
      if ((long)pcVar13 < 1) {
LAB_001116ed:
        hi->r_len = 0;
      }
      else {
        strncpy(pcVar2,pcVar11,(size_t)pcVar13);
        pcVar13[(long)hi->r_buf] = '\0';
        hi->r_len = (long)pcVar13;
      }
      return 0;
    }
    *pcVar7 = '\0';
    if ((long)pcVar7 - (long)pcVar11 < 1) {
      hi->header_end = '\x01';
      pcVar11 = pcVar7 + 2;
      if ((hi->response).chunked != '\x01') {
        hi->length = (hi->response).content_length;
        goto LAB_001111c0;
      }
      pcVar12 = pcVar2 + (hi->r_len - (long)pcVar11);
      if ((long)pcVar12 < 1) {
        hi->r_len = 0;
      }
      else {
        pcVar7 = strstr(pcVar11,"\r\n");
        if (pcVar7 != (char *)0x0) {
          *pcVar7 = '\0';
          lVar8 = strtol(pcVar11,(char **)0x0,0x10);
          hi->length = lVar8;
          if (lVar8 == 0) {
            (hi->response).chunked = '\0';
          }
          else {
            plVar10 = &(hi->response).content_length;
            *plVar10 = *plVar10 + lVar8;
          }
          pcVar11 = pcVar7 + 2;
          goto LAB_001111c0;
        }
LAB_00111719:
        strncpy(pcVar2,pcVar11,(size_t)pcVar12);
        hi->r_buf[(long)pcVar12] = '\0';
        hi->r_len = (long)pcVar12;
      }
      hi->length = -1;
      return 0;
    }
    pcVar11 = strtoken(pcVar11,local_138,0x100);
    if ((pcVar11 != (char *)0x0) &&
       (pcVar11 = strtoken(pcVar11,local_238,0x100), pcVar11 != (char *)0x0)) {
      iVar6 = strncasecmp(local_138,"HTTP",4);
      if (iVar6 == 0) {
        iVar6 = atoi(local_238);
        (hi->response).status = iVar6;
      }
      else {
        iVar6 = strncasecmp(local_138,"set-cookie:",0xb);
        if (iVar6 == 0) {
          snprintf((hi->response).cookie,0x200,"%s",local_238);
        }
        else {
          iVar6 = strncasecmp(local_138,"location:",9);
          if (iVar6 == 0) {
            sVar9 = strlen(local_238);
            strncpy(pcVar13,local_238,(long)(int)sVar9);
            pcVar13[(int)sVar9] = '\0';
          }
          else {
            iVar6 = strncasecmp(local_138,"content-length:",0xf);
            if (iVar6 == 0) {
              iVar6 = atoi(local_238);
              (hi->response).content_length = (long)iVar6;
            }
            else {
              iVar6 = strncasecmp(local_138,"transfer-encoding:",0x12);
              if (iVar6 == 0) {
                iVar6 = strncasecmp(local_238,"chunked",7);
                if (iVar6 == 0) {
                  (hi->response).chunked = '\x01';
                }
              }
              else {
                iVar6 = strncasecmp(local_138,"connection:",0xb);
                if ((iVar6 == 0) && (iVar6 = strncasecmp(local_238,"close",5), iVar6 == 0)) {
                  (hi->response).close = '\x01';
                }
              }
            }
          }
        }
      }
    }
LAB_00111533:
    pcVar11 = pcVar7 + 2;
  } while( true );
}

Assistant:

static int http_parse(HTTP_INFO *hi)
{
    char    *p1, *p2;
    long    len;


    if(hi->r_len <= 0) return -1;

    p1 = hi->r_buf;

    while(1)
    {
        if(hi->header_end == FALSE)     // header parser
        {
            if((p2 = strstr(p1, "\r\n")) != NULL)
            {
                len = (long)(p2 - p1);
                *p2 = 0;

                if(len > 0)
                {
                    // printf("header: %s(%ld)\n", p1, len);

                    http_header(hi, p1);
                    p1 = p2 + 2;    // skip CR+LF
                }
                else
                {
                    hi->header_end = TRUE; // reach the header-end.

                    // printf("header_end .... \n");

                    p1 = p2 + 2;    // skip CR+LF

                    if(hi->response.chunked == TRUE)
                    {
                        len = hi->r_len - (p1 - hi->r_buf);
                        if(len > 0)
                        {
                            if((p2 = strstr(p1, "\r\n")) != NULL)
                            {
                                *p2 = 0;

                                if((hi->length = strtol(p1, NULL, 16)) == 0)
                                {
                                    hi->response.chunked = FALSE;
                                }
                                else
                                {
                                    hi->response.content_length += hi->length;
                                }
                                p1 = p2 + 2;    // skip CR+LF
                            }
                            else
                            {
                                // copy the data as chunked size ...
                                strncpy(hi->r_buf, p1, len);
                                hi->r_buf[len] = 0;
                                hi->r_len = len;
                                hi->length = -1;

                                break;
                            }
                        }
                        else
                        {
                            hi->r_len = 0;
                            hi->length = -1;

                            break;
                        }
                    }
                    else
                    {
                        hi->length = hi->response.content_length;
                    }
                }

            }
            else
            {
                len = hi->r_len - (p1 - hi->r_buf);
                if(len  > 0)
                {
                    // keep the partial header data ...
                    strncpy(hi->r_buf, p1, len);
                    hi->r_buf[len] = 0;
                    hi->r_len = len;
                }
                else
                {
                    hi->r_len = 0;
                }

                break;
            }
        }
        else    // body parser ...
        {
            if(hi->response.chunked == TRUE && hi->length == -1)
            {
                len = hi->r_len - (p1 - hi->r_buf);
                if(len > 0)
                {
                    if ((p2 = strstr(p1, "\r\n")) != NULL)
                    {
                        *p2 = 0;

                        if((hi->length = strtol(p1, NULL, 16)) == 0)
                        {
                            hi->response.chunked = FALSE;
                        }
                        else
                        {
                            hi->response.content_length += hi->length;
                        }

                        p1 = p2 + 2;    // skip CR+LF
                    }
                    else
                    {
                        // copy the remain data as chunked size ...
                        strncpy(hi->r_buf, p1, len);
                        hi->r_buf[len] = 0;
                        hi->r_len = len;
                        hi->length = -1;

                        break;
                    }
                }
                else
                {
                    hi->r_len = 0;

                    break;
                }
            }
            else
            {
                if(hi->length > 0)
                {
                    len = hi->r_len - (p1 - hi->r_buf);

                    if(len > hi->length)
                    {
                        // copy the data for response ..
                        if(hi->body_len < hi->body_size-1)
                        {
                            if (hi->body_size > (hi->body_len + hi->length))
                            {
                                strncpy(&(hi->body[hi->body_len]), p1, hi->length);
                                hi->body_len += hi->length;
                                hi->body[hi->body_len] = 0;
                            }
                            else
                            {
                                strncpy(&(hi->body[hi->body_len]), p1, hi->body_size - hi->body_len - 1);
                                hi->body_len = hi->body_size - 1;
                                hi->body[hi->body_len] = 0;
                            }
                        }

                        p1 += hi->length;
                        len -= hi->length;

                        if(hi->response.chunked == TRUE && len >= 2)
                        {
                            p1 += 2;    // skip CR+LF
                            hi->length = -1;
                        }
                        else
                        {
                            return -1;
                        }
                    }
                    else
                    {
                        // copy the data for response ..
                        if(hi->body_len < hi->body_size-1)
                        {
                            if (hi->body_size > (hi->body_len + len))
                            {
                                strncpy(&(hi->body[hi->body_len]), p1, len);
                                hi->body_len += len;
                                hi->body[hi->body_len] = 0;
                            }
                            else
                            {
                                strncpy(&(hi->body[hi->body_len]), p1, hi->body_size - hi->body_len - 1);
                                hi->body_len = hi->body_size - 1;
                                hi->body[hi->body_len] = 0;
                            }
                        }

                        hi->length -= len;
                        hi->r_len = 0;

                        if(hi->response.chunked == FALSE && hi->length <= 0) return 1;

                        break;
                    }
                }
                else
                {
                    if(hi->response.chunked == FALSE) return 1;

                    // chunked size check ..
                    if((hi->r_len > 2) && (memcmp(p1, "\r\n", 2) == 0))
                    {
                        p1 += 2;
                        hi->length = -1;
                    }
                    else
                    {
                        hi->length = -1;
                        hi->r_len = 0;
                    }
                }
            }
        }
    }

    return 0;
}